

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<unsigned_long_long> *pGVar8;
  TransformerLogLin *pTVar9;
  ImPlotPlot *pIVar10;
  GetterXsYRef<unsigned_long_long> *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  long lVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  pIVar16 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  lVar19 = (long)(((pGVar8->Offset + prim) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride;
  uVar1 = *(unsigned_long_long *)((long)pGVar8->Xs + lVar19);
  uVar2 = *(unsigned_long_long *)((long)pGVar8->Ys + lVar19);
  dVar21 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar17 = GImPlot;
  pIVar10 = pIVar16->CurrentPlot;
  dVar3 = (pIVar10->XAxis).Range.Min;
  iVar18 = pTVar9->YAxis;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar11->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar11->Xs +
           (long)(((prim + pGVar11->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar11->Stride);
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar24 = (float)(pIVar16->My[iVar18] *
                   ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                   pIVar10->YAxis[iVar18].Range.Min) + (double)IVar4.y);
  fVar25 = (float)(pIVar16->Mx *
                   (((double)(float)(dVar21 / pIVar16->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar3) + dVar3) - dVar3) + (double)IVar4.x);
  dVar3 = pGVar11->YRef;
  dVar22 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar21 = (pIVar10->XAxis).Range.Min;
  iVar18 = pTVar9->YAxis;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar20 = (float)(pIVar17->Mx *
                   (((double)(float)(dVar22 / pIVar17->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar21) + dVar21) - dVar21) + (double)IVar4.x);
  fVar23 = (float)(pIVar17->My[iVar18] * (dVar3 - pIVar10->YAxis[iVar18].Range.Min) +
                  (double)IVar4.y);
  auVar29._0_4_ = ~-(uint)(fVar20 <= fVar25) & (uint)fVar20;
  auVar29._4_4_ = ~-(uint)(fVar23 <= fVar24) & (uint)fVar23;
  auVar29._8_4_ = ~-(uint)(fVar25 < fVar20) & (uint)fVar20;
  auVar29._12_4_ = ~-(uint)(fVar24 < fVar23) & (uint)fVar23;
  auVar14._4_4_ = (uint)fVar24 & -(uint)(fVar23 <= fVar24);
  auVar14._0_4_ = (uint)fVar25 & -(uint)(fVar20 <= fVar25);
  auVar14._8_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar20);
  auVar14._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar23);
  auVar29 = auVar29 | auVar14;
  fVar26 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar29._8_8_;
  auVar15._0_4_ = -(uint)(auVar29._4_4_ < fVar26);
  auVar30._0_8_ = auVar15._0_8_ << 0x20;
  auVar30._8_4_ = -(uint)(auVar29._8_4_ < (cull_rect->Max).x);
  auVar30._12_4_ = -(uint)(auVar29._12_4_ < (cull_rect->Max).y);
  auVar31._4_4_ = -(uint)(fVar26 < auVar29._4_4_);
  auVar31._0_4_ = -(uint)((cull_rect->Min).x < auVar29._0_4_);
  auVar31._8_8_ = auVar30._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar31);
  if (iVar18 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar26 = fVar20 - fVar25;
    fVar27 = fVar23 - fVar24;
    fVar28 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar28) {
      fVar28 = 1.0 / SQRT(fVar28);
      fVar26 = fVar26 * fVar28;
      fVar27 = fVar27 * fVar28;
    }
    fVar28 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar26 = fVar28 * fVar26;
    fVar28 = fVar28 * fVar27;
    (pIVar12->pos).x = fVar28 + fVar25;
    (pIVar12->pos).y = fVar24 - fVar26;
    (pIVar12->uv).x = IVar4.x;
    (pIVar12->uv).y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar28 + fVar20;
    pIVar12[1].pos.y = fVar23 - fVar26;
    pIVar12[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar20 - fVar28;
    pIVar12[2].pos.y = fVar23 + fVar26;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar25 - fVar28;
    pIVar12[3].pos.y = fVar26 + fVar24;
    pIVar12[3].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = uVar7;
    puVar13[1] = uVar7 + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13[3] = uVar7;
    puVar13[4] = uVar7 + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }